

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

bool __thiscall wallet::SQLiteBatch::HasKey(SQLiteBatch *this,DataStream *key)

{
  wallet *this_00;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  string *in_R9;
  pointer pbVar4;
  long in_FS_OFFSET;
  Span<const_std::byte> blob;
  allocator<char> local_59;
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_database->m_db != (sqlite3 *)0x0) {
    this_00 = (wallet *)this->m_read_stmt;
    if (this_00 == (wallet *)0x0) {
      __assert_fail("m_read_stmt",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x229,"virtual bool wallet::SQLiteBatch::HasKey(DataStream &&)");
    }
    pbVar1 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pbVar4 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start + key->m_read_pos;
    std::__cxx11::string::string<std::allocator<char>>(local_58,"key",&local_59);
    blob.m_size = (size_t)local_58;
    blob.m_data = pbVar1 + -(long)pbVar4;
    bVar2 = BindBlobToStatement(this_00,(sqlite3_stmt *)&DAT_00000001,(int)pbVar4,blob,in_R9);
    std::__cxx11::string::~string(local_58);
    if (bVar2) {
      iVar3 = sqlite3_step(this->m_read_stmt);
      sqlite3_clear_bindings(this->m_read_stmt);
      sqlite3_reset(this->m_read_stmt);
      bVar2 = iVar3 == 100;
      goto LAB_00495913;
    }
  }
  bVar2 = false;
LAB_00495913:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::HasKey(DataStream&& key)
{
    if (!m_database.m_db) return false;
    assert(m_read_stmt);

    // Bind: leftmost parameter in statement is index 1
    if (!BindBlobToStatement(m_read_stmt, 1, key, "key")) return false;
    int res = sqlite3_step(m_read_stmt);
    sqlite3_clear_bindings(m_read_stmt);
    sqlite3_reset(m_read_stmt);
    return res == SQLITE_ROW;
}